

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

opj_bool jp2_read_pclr_v2(opj_jp2_v2_t *jp2,uchar *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size,
                         opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  opj_jp2_pclr_t *poVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uchar *p_buffer;
  uint uVar9;
  OPJ_UINT32 l_value;
  uint local_50;
  uint local_4c;
  uint *local_48;
  uchar *local_40;
  ulong local_38;
  
  if ((jp2->color).jp2_pclr != (opj_jp2_pclr_t *)0x0) {
    return 0;
  }
  opj_read_bytes_LE(p_pclr_header_data,&local_50,2);
  uVar9 = local_50 & 0xffff;
  local_4c = uVar9;
  opj_read_bytes_LE(p_pclr_header_data + 2,&local_50,1);
  uVar5 = local_50;
  p_buffer = p_pclr_header_data + 3;
  uVar7 = local_50 & 0xffff;
  uVar8 = (ulong)uVar7;
  puVar1 = (uint *)malloc((ulong)(uVar7 * uVar9) << 2);
  puVar2 = (uchar *)malloc(uVar8);
  puVar3 = (uchar *)malloc(uVar8);
  poVar4 = (opj_jp2_pclr_t *)malloc(0x28);
  poVar4->channel_sign = puVar3;
  poVar4->channel_size = puVar2;
  poVar4->entries = puVar1;
  poVar4->nr_entries = (unsigned_short)local_4c;
  poVar4->nr_channels = (unsigned_short)uVar5;
  poVar4->cmap = (opj_jp2_cmap_comp_t *)0x0;
  (jp2->color).jp2_pclr = poVar4;
  local_48 = puVar1;
  local_40 = puVar2;
  local_38 = uVar8;
  if (uVar8 != 0) {
    uVar8 = 0;
    do {
      opj_read_bytes_LE(p_buffer + uVar8,&local_50,1);
      local_40[uVar8] = ((byte)local_50 & 0x7f) + 1;
      puVar3[uVar8] = (byte)local_50 >> 7;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    p_buffer = p_buffer + uVar8;
  }
  if (local_4c != 0) {
    puVar1 = local_48;
    puVar2 = local_40;
    local_48 = (uint *)0;
    do {
      if ((int)local_38 != 0) {
        lVar6 = 0;
        uVar8 = 0;
        do {
          opj_read_bytes_LE(p_buffer,&local_50,(uint)(puVar2[uVar8] >> 3));
          p_buffer = p_buffer + (local_40[uVar8] >> 3);
          puVar1[uVar8] = local_50;
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + -4;
          puVar2 = local_40;
        } while (uVar7 != uVar8);
        puVar1 = (uint *)((long)puVar1 - lVar6);
      }
      uVar5 = (int)local_48 + 1;
      local_48 = (uint *)(ulong)uVar5;
    } while (uVar5 != local_4c);
  }
  return 1;
}

Assistant:

opj_bool jp2_read_pclr_v2(	opj_jp2_v2_t *jp2,
							unsigned char * p_pclr_header_data,
							OPJ_UINT32 p_pclr_header_size,
							opj_event_mgr_t * p_manager
						  ){
	opj_jp2_pclr_t *jp2_pclr;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	OPJ_UINT16 nr_entries,nr_channels;
	OPJ_UINT16 i, j;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(p_pclr_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if(jp2->color.jp2_pclr)
		return OPJ_FALSE;

	opj_read_bytes(p_pclr_header_data, &l_value , 2);	/* NE */
	p_pclr_header_data += 2;
	nr_entries = (OPJ_UINT16) l_value;

	opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* NPC */
	++p_pclr_header_data;
	nr_channels = (OPJ_UINT16) l_value;

	entries = (OPJ_UINT32*) opj_malloc(nr_channels * nr_entries * sizeof(OPJ_UINT32));
	channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
	channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);

	jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
	jp2_pclr->channel_sign = channel_sign;
	jp2_pclr->channel_size = channel_size;
	jp2_pclr->entries = entries;
	jp2_pclr->nr_entries = nr_entries;
	jp2_pclr->nr_channels = nr_channels;
	jp2_pclr->cmap = NULL;

	jp2->color.jp2_pclr = jp2_pclr;

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* Bi */
		++p_pclr_header_data;

		channel_size[i] = (l_value & 0x7f) + 1;
		channel_sign[i] = (l_value & 0x80)? 1 : 0;
	}

	for(j = 0; j < nr_entries; ++j) {
		for(i = 0; i < nr_channels; ++i) {
			/**entries++ = cio_read(cio, channel_size[i]>>3); */
			opj_read_bytes(p_pclr_header_data, &l_value , channel_size[i]>>3);	/* Cji */
			p_pclr_header_data += channel_size[i]>>3;
			*entries = (OPJ_UINT32) l_value;
			entries++;
		}
	}

	return OPJ_TRUE;
}